

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseBuilder::embedLabel(BaseBuilder *this,Label *label,size_t dataSize)

{
  Error EVar1;
  ulong uVar2;
  EmbedLabelNode *node;
  uint local_18;
  uint32_t local_14;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar1 = 5;
  }
  else {
    if ((dataSize != 0) &&
       ((8 < dataSize ||
        (uVar2 = dataSize - (dataSize >> 1 & 0x5555555555555555),
        uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333),
        1 < (byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))))) {
      EVar1 = BaseEmitter::reportError(&this->super_BaseEmitter,2,(char *)0x0);
      return EVar1;
    }
    local_14 = (label->super_Operand).super_Operand_._baseId;
    local_18 = (uint)dataSize;
    EVar1 = _newNodeT<asmjit::v1_14::EmbedLabelNode,unsigned_int,unsigned_int>
                      (this,&node,&local_14,&local_18);
    if (EVar1 == 0) {
      addNode(this,(BaseNode *)node);
    }
  }
  return EVar1;
}

Assistant:

Error BaseBuilder::embedLabel(const Label& label, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!BaseBuilder_checkDataSize(dataSize))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  EmbedLabelNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedLabelNode>(&node, label.id(), uint32_t(dataSize)));

  addNode(node);
  return kErrorOk;
}